

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::CollapseSide(ON_NurbsSurface *this,int side,ON_3dPoint point)

{
  bool bVar1;
  undefined1 local_70 [8];
  ON_4dPoint cv;
  int j;
  int i;
  int j1;
  int j0;
  int i1;
  int i0;
  double local_30;
  double local_28;
  int local_1c;
  ON_NurbsSurface *pOStack_18;
  int side_local;
  ON_NurbsSurface *this_local;
  
  local_1c = side;
  pOStack_18 = this;
  bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
  if (bVar1) {
    CornerAt((ON_3dPoint *)&i1,&this->super_ON_Surface,local_1c);
    point.x = _i1;
    point.y = local_30;
    point.z = local_28;
    bVar1 = ON_3dPoint::operator==(&point,&ON_3dPoint::UnsetPoint);
    if (bVar1) {
      return false;
    }
  }
  if (this->m_cv == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    j0 = 0;
    j1 = this->m_cv_count[0];
    i = 0;
    j = this->m_cv_count[1];
    switch(local_1c) {
    case 0:
      j = 1;
      break;
    case 1:
      j0 = j1 + -1;
      break;
    case 2:
      i = j + -1;
      break;
    case 3:
      j1 = 1;
      break;
    default:
      return false;
    }
    if ((j0 < j1) && (i < j)) {
      for (cv.w._4_4_ = j0; cv.w._4_4_ < j1; cv.w._4_4_ = cv.w._4_4_ + 1) {
        for (cv.w._0_4_ = i; cv.w._0_4_ < j; cv.w._0_4_ = cv.w._0_4_ + 1) {
          bVar1 = GetCV(this,cv.w._4_4_,cv.w._0_4_,(ON_4dPoint *)local_70);
          if (!bVar1) {
            return false;
          }
          local_70 = (undefined1  [8])(point.x * cv.z);
          cv.x = point.y * cv.z;
          cv.y = point.z * cv.z;
          bVar1 = SetCV(this,cv.w._4_4_,cv.w._0_4_,(ON_4dPoint *)local_70);
          if (!bVar1) {
            return false;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::CollapseSide(
       int side,
       ON_3dPoint point
       )
{
  if ( point == ON_3dPoint::UnsetPoint )
  {
    point = CornerAt(*this,side);
    if ( point == ON_3dPoint::UnsetPoint )
      return false;
  }

  if ( !m_cv )
    return false;

  int i0 = 0;
  int i1 = m_cv_count[0];
  int j0 = 0;
  int j1 = m_cv_count[1];

  switch (side)
  {
  case 0: // south
    j1 = j0+1;
    break;
  case 1: // east
    i0 = i1-1;
    break;
  case 2: // north
    j0 = j1-1;
    break;
  case 3: // west
    i1 = i0+1;
    break;
  default:
    return false;
    break;
  }

  if ( i0 >= i1 || j0 >= j1 )
    return false;

  int i, j;
  ON_4dPoint cv;
  for ( i = i0; i < i1; i++ ) for ( j = j0; j < j1; j++ )
  {
    if ( !GetCV(i,j,cv) )
      return false;
    cv.x = point.x*cv.w;
    cv.y = point.y*cv.w;
    cv.z = point.z*cv.w;
    if ( !SetCV(i,j,cv) )
      return false;
  }
  return true;
}